

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

char * phosg::realpath(char *__name,char *__resolved)

{
  char *pcVar1;
  char *__resolved_00;
  cannot_stat_file *this;
  size_t __n;
  allocator<char> local_1a;
  undefined1 local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *path_local;
  string *data;
  
  local_19 = 0;
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__resolved;
  path_local = (string *)__name;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__name,0x1000,'\0',&local_1a);
  ::std::allocator<char>::~allocator(&local_1a);
  pcVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (local_18);
  __resolved_00 =
       ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name);
  pcVar1 = ::realpath(pcVar1,__resolved_00);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name);
    __n = strlen(pcVar1);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name);
    return __name;
  }
  this = (cannot_stat_file *)__cxa_allocate_exception(0x20);
  cannot_stat_file::cannot_stat_file(this,(string *)local_18);
  __cxa_throw(this,&cannot_stat_file::typeinfo,cannot_stat_file::~cannot_stat_file);
}

Assistant:

string realpath(const string& path) {
  string data(PATH_MAX, 0);
  if (!::realpath(path.c_str(), data.data())) {
    throw cannot_stat_file(path);
  }
  data.resize(strlen(data.c_str()));
  data.shrink_to_fit();
  return data;
}